

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void DebugSetLogfile(char *filename)

{
  char cVar1;
  size_type sVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  undefined2 *local_58;
  undefined8 local_50;
  undefined2 local_48;
  undefined1 uStack_46;
  undefined5 uStack_45;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if (filename != (char *)0x0) {
    cVar1 = *filename;
    if (((cVar1 == '/') || (cVar1 == '\\')) ||
       ((iVar3 = isalpha((int)cVar1), iVar3 != 0 && (filename[1] == ':')))) {
      sVar2 = g_logfilename_abi_cxx11_._M_string_length;
      strlen(filename);
      std::__cxx11::string::_M_replace(0x147370,0,(char *)sVar2,(ulong)filename);
    }
    else {
      local_48 = 0x2f2e;
      local_50 = 2;
      uStack_46 = 0;
      local_58 = &local_48;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_28 = *plVar5;
        lStack_20 = plVar4[3];
        local_38 = &local_28;
      }
      else {
        local_28 = *plVar5;
        local_38 = (long *)*plVar4;
      }
      local_30 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&g_logfilename_abi_cxx11_,(string *)&local_38);
      if (local_38 != &local_28) {
        operator_delete(local_38,local_28 + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT53(uStack_45,CONCAT12(uStack_46,local_48)) + 1);
      }
    }
    g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags | 8;
    return;
  }
  g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags & 0xf7;
  g_logfilename_abi_cxx11_._M_string_length = 0;
  *g_logfilename_abi_cxx11_._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void DebugSetLogfile(const char *filename)
{
    if (filename) {
#ifdef WIN32
        g_log_mutex= CreateMutex(NULL, false, NULL);
#endif
        if (filename[0]=='\\' || filename[0]=='/' || (isalpha(filename[0]) && filename[1]==':'))
            g_logfilename= filename;
        else
            g_logfilename= GetLogRootDir() + filename;
        g_debugOutputFlags |= DBG_LOGFILE;
        //MessageBox(0, _T("opening log"), ToTString(g_logfilename).c_str(), 0);
    }
    else {
        //MessageBox(0, _T("closing log"), _T("debug"), 0);
        g_debugOutputFlags &= ~DBG_LOGFILE;
#ifdef WIN32
        if (g_log_mutex && WaitForSingleObject(g_log_mutex, INFINITE)==WAIT_OBJECT_0) {
            CloseHandle(g_log_mutex);
            g_log_mutex= NULL;
        }
#endif
        g_logfilename.clear();
    }
}